

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_delete.cpp
# Opt level: O2

SinkResultType __thiscall
duckdb::PhysicalDelete::Sink
          (PhysicalDelete *this,ExecutionContext *context,DataChunk *chunk,OperatorSinkInput *input)

{
  pthread_mutex_t *__mutex;
  __pthread_list_t *p_Var1;
  GlobalSinkState *pGVar2;
  size_type __n;
  pointer puVar3;
  DataTable *pDVar4;
  DataChunk *pDVar5;
  pointer pSVar6;
  int iVar7;
  DuckTransaction *transaction;
  __buckets_ptr pp_Var8;
  type pIVar9;
  Allocator *allocator;
  idx_t iVar10;
  reference pvVar11;
  reference other;
  reference pvVar12;
  LocalStorage *pLVar13;
  LocalTableStorage *pLVar14;
  BoundIndex *this_00;
  type pTVar15;
  InternalException *this_01;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *index;
  bool *__value;
  pointer puVar16;
  ulong __n_00;
  StorageIndex *col;
  __node_base *p_Var17;
  pointer pSVar18;
  __buckets_ptr pp_Var19;
  size_type __n_01;
  reference rVar20;
  allocator local_269;
  DuckTransaction *local_268;
  ExecutionContext *local_260;
  GlobalSinkState *local_258;
  reference local_250;
  LocalSinkState *local_248;
  DataChunk *local_240;
  vector<duckdb::StorageIndex,_true> column_ids;
  vector<duckdb::LogicalType,_true> types;
  vector<duckdb::LogicalType,_true> column_types;
  IndexAppendInfo index_append_info;
  optional_ptr<duckdb::LocalTableStorage,_true> storage_1;
  vector<bool,_true> to_be_fetched;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  indexed_column_id_set;
  DataChunk fetch_chunk;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  LogicalType local_98;
  optional_ptr<duckdb::LocalTableStorage,_true> storage;
  element_type *peStack_50;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_48;
  reference<DataTable> rStack_40;
  Allocator *local_38;
  
  pGVar2 = input->global_state;
  local_248 = input->local_state;
  local_260 = context;
  transaction = DuckTransaction::Get(context->client,this->table->db);
  local_240 = chunk;
  local_250 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,this->row_id_index);
  __mutex = (pthread_mutex_t *)(pGVar2 + 1);
  local_258 = pGVar2;
  ::std::mutex::lock((mutex *)&__mutex->__data);
  if ((this->return_chunk == false) && (local_258[5].state == READY)) {
    pDVar4 = this->table;
    pTVar15 = unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>
              ::operator*((unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>
                           *)&local_248[2].partition_info.min_batch_index);
    iVar10 = DataTable::Delete(pDVar4,pTVar15,local_260->client,local_250,local_240->count);
    p_Var1 = &local_258[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.
              __list;
    p_Var1->__prev = (__pthread_internal_list *)((long)&p_Var1->__prev->__prev + iVar10);
  }
  else {
    DataTable::GetTypes(&types,this->table);
    __value = &this->return_chunk;
    ::std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&to_be_fetched,
               ((long)types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x18,__value,
               (allocator_type *)&indexed_column_id_set);
    column_ids.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
    super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    column_ids.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
    super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    column_ids.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
    super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (*__value == true) {
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                (&column_types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 &types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
      pp_Var19 = (__buckets_ptr)0x0;
      while( true ) {
        indexed_column_id_set._M_h._M_buckets = pp_Var19;
        pp_Var8 = (__buckets_ptr)DataTable::ColumnCount(this->table);
        if (pp_Var8 <= pp_Var19) break;
        ::std::vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>>::
        emplace_back<unsigned_long&>
                  ((vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>> *)&column_ids,
                   (unsigned_long *)&indexed_column_id_set);
        pp_Var19 = (__buckets_ptr)((long)indexed_column_id_set._M_h._M_buckets + 1);
      }
    }
    else {
      pLVar13 = LocalStorage::Get(local_260->client,this->table->db);
      local_268 = transaction;
      storage = LocalStorage::GetStorage(pLVar13,this->table);
      indexed_column_id_set._M_h._M_buckets = &indexed_column_id_set._M_h._M_single_bucket;
      indexed_column_id_set._M_h._M_bucket_count = 1;
      indexed_column_id_set._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      indexed_column_id_set._M_h._M_element_count = 0;
      indexed_column_id_set._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      indexed_column_id_set._M_h._M_rehash_policy._M_next_resize = 0;
      indexed_column_id_set._M_h._M_single_bucket = (__node_base_ptr)0x0;
      pLVar14 = optional_ptr<duckdb::LocalTableStorage,_true>::operator->(&storage);
      ::std::mutex::lock(&(pLVar14->delete_indexes).indexes_lock);
      p_Var17 = &indexed_column_id_set._M_h._M_before_begin;
      puVar3 = (pLVar14->delete_indexes).indexes.
               super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar16 = (pLVar14->delete_indexes).indexes.
                     super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar3;
          puVar16 = puVar16 + 1) {
        pIVar9 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator*
                           (puVar16);
        iVar7 = (*pIVar9->_vptr_Index[2])(pIVar9);
        if ((char)iVar7 != '\0') {
          iVar7 = (*pIVar9->_vptr_Index[5])(pIVar9);
          if ((byte)((char)iVar7 - 1U) < 2) {
            ::std::__detail::
            _Insert_base<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::insert<std::__detail::_Node_const_iterator<unsigned_long,true,false>>
                      ((_Insert_base<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)&indexed_column_id_set,
                       (_Node_const_iterator<unsigned_long,_true,_false>)
                       (pIVar9->column_id_set)._M_h._M_before_begin._M_nxt,
                       (_Node_const_iterator<unsigned_long,_true,_false>)0x0);
          }
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)&pLVar14->delete_indexes);
      while (p_Var17 = p_Var17->_M_nxt, p_Var17 != (__node_base *)0x0) {
        ::std::vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>>::
        emplace_back<unsigned_long_const&>
                  ((vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>> *)&column_ids,
                   (unsigned_long *)(p_Var17 + 1));
      }
      ::std::
      __sort<__gnu_cxx::__normal_iterator<duckdb::StorageIndex*,std::vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (column_ids.
                 super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                 super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 column_ids.
                 super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                 super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      pSVar6 = column_ids.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
               super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pSVar18 = column_ids.
                     super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                     super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                     ._M_impl.super__Vector_impl_data._M_start; pSVar18 != pSVar6;
          pSVar18 = pSVar18 + 1) {
        __n = pSVar18->index;
        rVar20 = vector<bool,_true>::get<true>(&to_be_fetched,__n);
        *rVar20._M_p = *rVar20._M_p | rVar20._M_mask;
        pvVar12 = vector<duckdb::LogicalType,_true>::get<true>(&types,__n);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (&column_types.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,pvVar12)
        ;
      }
      ::std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&indexed_column_id_set._M_h);
      transaction = local_268;
    }
    local_268 = (DuckTransaction *)(local_248 + 1);
    DataChunk::Reset((DataChunk *)local_268);
    Vector::Flatten(local_250,local_240->count);
    DataChunk::DataChunk(&fetch_chunk);
    allocator = Allocator::Get(local_260->client);
    pDVar5 = local_240;
    DataChunk::Initialize(&fetch_chunk,allocator,&column_types,local_240->count);
    storage.ptr = (LocalTableStorage *)&stack0xffffffffffffffb0;
    local_38 = (Allocator *)0x0;
    peStack_50 = (element_type *)0x0;
    local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    rStack_40._M_data = (DataTable *)0x0;
    DataTable::Fetch(this->table,transaction,&fetch_chunk,&column_ids,local_250,pDVar5->count,
                     (ColumnFetchState *)&storage);
    __n_01 = 0;
    __n_00 = 0;
    while( true ) {
      iVar10 = DataTable::ColumnCount(this->table);
      if (iVar10 <= __n_00) break;
      rVar20 = vector<bool,_true>::get<true>(&to_be_fetched,__n_00);
      if ((*rVar20._M_p & rVar20._M_mask) == 0) {
        pvVar11 = vector<duckdb::Vector,_true>::get<true>
                            ((vector<duckdb::Vector,_true> *)local_268,__n_00);
        pvVar12 = vector<duckdb::LogicalType,_true>::get<true>(&types,__n_00);
        LogicalType::LogicalType(&local_98,pvVar12);
        Value::Value((Value *)&indexed_column_id_set,&local_98);
        Vector::Reference(pvVar11,(Value *)&indexed_column_id_set);
        Value::~Value((Value *)&indexed_column_id_set);
        LogicalType::~LogicalType(&local_98);
      }
      else {
        pvVar11 = vector<duckdb::Vector,_true>::get<true>
                            ((vector<duckdb::Vector,_true> *)local_268,__n_00);
        other = vector<duckdb::Vector,_true>::get<true>(&fetch_chunk.data,__n_01);
        Vector::Reference(pvVar11,other);
        __n_01 = __n_01 + 1;
      }
      __n_00 = __n_00 + 1;
    }
    local_248[1].partition_info.partition_data.
    super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
    super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)fetch_chunk.count;
    if ((local_258[5].state & fetch_chunk.count != 0) != READY) {
      pLVar13 = LocalStorage::Get(local_260->client,this->table->db);
      storage_1 = LocalStorage::GetStorage(pLVar13,this->table);
      index_append_info.append_mode = IGNORE_DUPLICATES;
      index_append_info.delete_index.ptr = (BoundIndex *)0x0;
      pLVar14 = optional_ptr<duckdb::LocalTableStorage,_true>::operator->(&storage_1);
      ::std::mutex::lock(&(pLVar14->delete_indexes).indexes_lock);
      puVar3 = (pLVar14->delete_indexes).indexes.
               super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar16 = (pLVar14->delete_indexes).indexes.
                     super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar3;
          puVar16 = puVar16 + 1) {
        this_00 = (BoundIndex *)
                  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator*
                            (puVar16);
        iVar7 = (*(this_00->super_Index)._vptr_Index[2])(this_00);
        if ((char)iVar7 != '\0') {
          iVar7 = (*(this_00->super_Index)._vptr_Index[5])(this_00);
          if ((byte)((char)iVar7 - 1U) < 2) {
            BoundIndex::Append((ErrorData *)&indexed_column_id_set,this_00,(DataChunk *)local_268,
                               local_250,&index_append_info);
            if ((char)indexed_column_id_set._M_h._M_buckets == '\x01') {
              this_01 = (InternalException *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&local_b8,"failed to update delete ART in physical delete: ",
                         &local_269);
              ::std::__cxx11::string::string
                        ((string *)&local_d8,
                         (string *)&indexed_column_id_set._M_h._M_rehash_policy._M_next_resize);
              InternalException::InternalException<std::__cxx11::string>
                        (this_01,&local_b8,&local_d8);
              __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error)
              ;
            }
            ErrorData::~ErrorData((ErrorData *)&indexed_column_id_set);
          }
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)&pLVar14->delete_indexes);
    }
    if (*__value == true) {
      ColumnDataCollection::Append
                ((ColumnDataCollection *)
                 &local_258[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data
                  .__list.__next,(DataChunk *)local_268);
    }
    pDVar4 = this->table;
    pTVar15 = unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>
              ::operator*((unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>
                           *)&local_248[2].partition_info.min_batch_index);
    iVar10 = DataTable::Delete(pDVar4,pTVar15,local_260->client,local_250,local_240->count);
    p_Var1 = &local_258[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.
              __list;
    p_Var1->__prev = (__pthread_internal_list *)((long)&p_Var1->__prev->__prev + iVar10);
    ColumnFetchState::~ColumnFetchState((ColumnFetchState *)&storage);
    DataChunk::~DataChunk(&fetch_chunk);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              (&column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
              );
    ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector
              (&column_ids.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
              );
    ::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              ((_Bvector_base<std::allocator<bool>_> *)&to_be_fetched);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  }
  pthread_mutex_unlock(__mutex);
  return NEED_MORE_INPUT;
}

Assistant:

SinkResultType PhysicalDelete::Sink(ExecutionContext &context, DataChunk &chunk, OperatorSinkInput &input) const {
	auto &g_state = input.global_state.Cast<DeleteGlobalState>();
	auto &l_state = input.local_state.Cast<DeleteLocalState>();

	auto &transaction = DuckTransaction::Get(context.client, table.db);
	auto &row_ids = chunk.data[row_id_index];

	lock_guard<mutex> delete_guard(g_state.delete_lock);
	if (!return_chunk && !g_state.has_unique_indexes) {
		g_state.deleted_count += table.Delete(*l_state.delete_state, context.client, row_ids, chunk.size());
		return SinkResultType::NEED_MORE_INPUT;
	}

	auto types = table.GetTypes();
	auto to_be_fetched = vector<bool>(types.size(), return_chunk);
	vector<StorageIndex> column_ids;
	vector<LogicalType> column_types;
	if (return_chunk) {
		// Fetch all columns.
		column_types = types;
		for (idx_t i = 0; i < table.ColumnCount(); i++) {
			column_ids.emplace_back(i);
		}

	} else {
		// Fetch only the required columns for updating the delete indexes.
		auto &local_storage = LocalStorage::Get(context.client, table.db);
		auto storage = local_storage.GetStorage(table);
		unordered_set<column_t> indexed_column_id_set;
		storage->delete_indexes.Scan([&](Index &index) {
			if (!index.IsBound() || !index.IsUnique()) {
				return false;
			}
			auto &set = index.GetColumnIdSet();
			indexed_column_id_set.insert(set.begin(), set.end());
			return false;
		});
		for (auto &col : indexed_column_id_set) {
			column_ids.emplace_back(col);
		}
		sort(column_ids.begin(), column_ids.end());
		for (auto &col : column_ids) {
			auto i = col.GetPrimaryIndex();
			to_be_fetched[i] = true;
			column_types.push_back(types[i]);
		}
	}

	l_state.delete_chunk.Reset();
	row_ids.Flatten(chunk.size());

	// Fetch the to-be-deleted chunk.
	DataChunk fetch_chunk;
	fetch_chunk.Initialize(Allocator::Get(context.client), column_types, chunk.size());
	auto fetch_state = ColumnFetchState();
	table.Fetch(transaction, fetch_chunk, column_ids, row_ids, chunk.size(), fetch_state);

	// Reference the necessary columns of the fetch_chunk.
	idx_t fetch_idx = 0;
	for (idx_t i = 0; i < table.ColumnCount(); i++) {
		if (to_be_fetched[i]) {
			l_state.delete_chunk.data[i].Reference(fetch_chunk.data[fetch_idx++]);
			continue;
		}
		l_state.delete_chunk.data[i].Reference(Value(types[i]));
	}
	l_state.delete_chunk.SetCardinality(fetch_chunk);

	// Append the deleted row IDs to the delete indexes.
	// If we only delete local row IDs, then the delete_chunk is empty.
	if (g_state.has_unique_indexes && l_state.delete_chunk.size() != 0) {
		auto &local_storage = LocalStorage::Get(context.client, table.db);
		auto storage = local_storage.GetStorage(table);
		IndexAppendInfo index_append_info(IndexAppendMode::IGNORE_DUPLICATES, nullptr);
		storage->delete_indexes.Scan([&](Index &index) {
			if (!index.IsBound() || !index.IsUnique()) {
				return false;
			}
			auto &bound_index = index.Cast<BoundIndex>();
			auto error = bound_index.Append(l_state.delete_chunk, row_ids, index_append_info);
			if (error.HasError()) {
				throw InternalException("failed to update delete ART in physical delete: ", error.Message());
			}
			return false;
		});
	}

	// Append the return_chunk to the return collection.
	if (return_chunk) {
		g_state.return_collection.Append(l_state.delete_chunk);
	}

	g_state.deleted_count += table.Delete(*l_state.delete_state, context.client, row_ids, chunk.size());
	return SinkResultType::NEED_MORE_INPUT;
}